

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Material::Internal_WriteV5(ON_Material *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *pOVar1;
  bool bVar2;
  int iVar3;
  ON_UUID *uuid;
  ON_Texture *o;
  ON_RdkMaterialInstanceIdObsoleteUserData *this_00;
  ON_UUID OVar4;
  bool local_91;
  undefined8 local_68;
  uchar local_60 [8];
  ON_RdkMaterialInstanceIdObsoleteUserData *ud;
  ON_wString local_48;
  ON_wString obsolete_flamingo_library;
  int local_38;
  int count;
  int i;
  undefined1 local_28 [15];
  byte local_19;
  int minor_version;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_Material *this_local;
  
  local_19 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar3 < 4) {
    local_19 = Internal_WriteV3(this,_minor_version);
  }
  else {
    local_19 = ON_BinaryArchive::Write3dmChunkVersion(_minor_version,2,0);
    iVar3 = ON_BinaryArchive::Archive3dmVersion(_minor_version);
    local_28._8_4_ = 3;
    if (0x3b < iVar3) {
      local_28._8_4_ = 6;
    }
    if ((local_19 & 1) != 0) {
      local_19 = ON_BinaryArchive::BeginWrite3dmChunk(_minor_version,0x40008000,1,local_28._8_4_);
    }
    pOVar1 = _minor_version;
    if ((local_19 & 1) != 0) {
      if ((local_19 & 1) != 0) {
        uuid = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
        local_19 = ON_BinaryArchive::WriteUuid(pOVar1,uuid);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                             (_minor_version,&this->super_ON_ModelComponent);
      }
      pOVar1 = _minor_version;
      if ((local_19 & 1) != 0) {
        ON_ModelComponent::Name((ON_ModelComponent *)local_28);
        local_19 = ON_BinaryArchive::WriteString(pOVar1,(ON_wString *)local_28);
        ON_wString::~ON_wString((ON_wString *)local_28);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteUuid(_minor_version,&this->m_plugin_id);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteColor(_minor_version,&this->m_ambient);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteColor(_minor_version,&this->m_diffuse);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteColor(_minor_version,&this->m_emission);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteColor(_minor_version,&this->m_specular);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteColor(_minor_version,&this->m_reflection);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteColor(_minor_version,&this->m_transparent);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteDouble(_minor_version,this->m_index_of_refraction);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteDouble(_minor_version,this->m_reflectivity);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteDouble(_minor_version,this->m_shine);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::WriteDouble(_minor_version,this->m_transparency);
      }
      if ((local_19 & 1) != 0) {
        local_19 = ON_BinaryArchive::BeginWrite3dmChunk(_minor_version,0x40008000,1,0);
        if ((bool)local_19) {
          obsolete_flamingo_library.m_s._4_4_ =
               ON_ClassArray<ON_Texture>::Count(&(this->m_textures).super_ON_ClassArray<ON_Texture>)
          ;
          local_19 = ON_BinaryArchive::WriteInt(_minor_version,obsolete_flamingo_library.m_s._4_4_);
          local_38 = 0;
          while( true ) {
            pOVar1 = _minor_version;
            local_91 = false;
            if (local_38 < obsolete_flamingo_library.m_s._4_4_) {
              local_91 = (bool)local_19;
            }
            if (local_91 == false) break;
            o = ON_ClassArray<ON_Texture>::operator[]
                          (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_38);
            local_19 = ON_BinaryArchive::WriteObject(pOVar1,&o->super_ON_Object);
            local_38 = local_38 + 1;
          }
          bVar2 = ON_BinaryArchive::EndWrite3dmChunk(_minor_version);
          if (!bVar2) {
            local_19 = 0;
          }
        }
        ON_wString::ON_wString(&local_48,&ON_wString::EmptyString);
        if ((local_19 & 1) != 0) {
          local_19 = ON_BinaryArchive::WriteString(_minor_version,&local_48);
        }
        if ((local_19 & 1) != 0) {
          local_19 = ON_BinaryArchive::WriteArray(_minor_version,&this->m_material_channel);
        }
        local_19 = ON_BinaryArchive::WriteBool(_minor_version,(bool)(this->m_bShareable & 1));
        if (((((((bool)local_19) &&
               (local_19 = ON_BinaryArchive::WriteBool
                                     (_minor_version,(bool)(this->m_bDisableLighting & 1)),
               (bool)local_19)) && (3 < (int)local_28._8_4_)) &&
             (((local_19 = ON_BinaryArchive::WriteBool
                                     (_minor_version,(bool)(this->m_bFresnelReflections & 1)),
               (bool)local_19 &&
               (local_19 = ON_BinaryArchive::WriteDouble
                                     (_minor_version,this->m_reflection_glossiness), (bool)local_19)
               ) && ((local_19 = ON_BinaryArchive::WriteDouble
                                           (_minor_version,this->m_refraction_glossiness),
                     (bool)local_19 &&
                     (local_19 = ON_BinaryArchive::WriteDouble
                                           (_minor_version,this->m_fresnel_index_of_refraction),
                     (bool)local_19)))))) &&
            (((int)local_28._8_4_ < 5 ||
             (local_19 = ON_BinaryArchive::WriteUuid
                                   (_minor_version,&this->m_rdk_material_instance_id),
             (bool)local_19)))) && (5 < (int)local_28._8_4_)) {
          local_19 = ON_BinaryArchive::WriteBool
                               (_minor_version,
                                (bool)(this->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture &
                                      1));
        }
        ON_wString::~ON_wString(&local_48);
      }
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk(_minor_version);
      if (!bVar2) {
        local_19 = 0;
      }
    }
  }
  if ((((local_19 & 1) != 0) &&
      (iVar3 = ON_BinaryArchive::Archive3dmVersion(_minor_version), iVar3 < 0x3c)) &&
     (bVar2 = RdkMaterialInstanceIdIsNotNil(this), bVar2)) {
    this_00 = (ON_RdkMaterialInstanceIdObsoleteUserData *)operator_new(0xe8);
    ON_RdkMaterialInstanceIdObsoleteUserData::ON_RdkMaterialInstanceIdObsoleteUserData(this_00);
    OVar4 = RdkMaterialInstanceId(this);
    local_68 = OVar4._0_8_;
    (this_00->m_rdk_material_instance_id).Data1 = (undefined4)local_68;
    (this_00->m_rdk_material_instance_id).Data2 = local_68._4_2_;
    (this_00->m_rdk_material_instance_id).Data3 = local_68._6_2_;
    local_60 = OVar4.Data4;
    *&(this_00->m_rdk_material_instance_id).Data4 = local_60;
    ON_Object::AttachUserData((ON_Object *)this,(ON_UserData *)this_00);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool ON_Material::Internal_WriteV5( ON_BinaryArchive& file ) const
{
  bool rc = false;
  if ( file.Archive3dmVersion() <= 3 )
  {
    // V2 or V3 file format
    rc = Internal_WriteV3(file);
  }
  else
  {
    // V4 file format

    // The chunk version 2.0 prevents old V3 IO code from attempting
    // to read this material
    rc = file.Write3dmChunkVersion(2,0); // never change the 2,0


    // version 1.2 field (20061113*)
    // version 1.3 fields (20100917*)
    // version 1.4 fields 6.0.2013-11-6
    // version 1.5 fields 6.0.2014-05-16 (RDK material instance id)
    // version 1.6 fields 6.0.2014-07-11 (m_bUseDiffuseTextureAlphaForObjectTransparencyTexture)
    const int minor_version = (file.Archive3dmVersion() >= 60) ? 6 : 3;
    if (rc) rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,minor_version);
    if (rc)
    {
      for(;;)
      {
        if ( rc ) rc = file.WriteUuid(Id());
        if ( rc ) rc = file.Write3dmReferencedComponentIndex(*this);
        if ( rc ) rc = file.WriteString(Name());

        if ( rc ) rc = file.WriteUuid(m_plugin_id);

        if ( rc ) rc = file.WriteColor( m_ambient );
        if ( rc ) rc = file.WriteColor( m_diffuse );
        if ( rc ) rc = file.WriteColor( m_emission );
        if ( rc ) rc = file.WriteColor( m_specular );
        if ( rc ) rc = file.WriteColor( m_reflection );
        if ( rc ) rc = file.WriteColor( m_transparent );

        if ( rc ) rc = file.WriteDouble( m_index_of_refraction );
        if ( rc ) rc = file.WriteDouble( m_reflectivity );
        if ( rc ) rc = file.WriteDouble( m_shine );
        if ( rc ) rc = file.WriteDouble( m_transparency );

        if ( !rc )
          break;

        // array of textures written in a way that user data persists
        rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
        if (rc)
        {
          int i, count = m_textures.Count();
          rc = file.WriteInt(count);
          for ( i = 0; i < count && rc; i++ )
          {
            rc = file.WriteObject(&m_textures[i]);
          }
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }

        //version 1.1 field
        ON_wString obsolete_flamingo_library = ON_wString::EmptyString;
        if (rc) rc = file.WriteString(obsolete_flamingo_library);

        // version 1.2 field (20061113)
        if (rc) rc = file.WriteArray(m_material_channel);

        // version 1.3 fields (20100917*)
        rc = file.WriteBool(m_bShareable);
        if (!rc) break;
        rc = file.WriteBool(m_bDisableLighting);
        if (!rc) break;

        if ( minor_version >= 4 )
        {
          rc = file.WriteBool(m_bFresnelReflections);
          if (!rc) break;
          rc = file.WriteDouble(m_reflection_glossiness);
          if (!rc) break;
          rc = file.WriteDouble(m_refraction_glossiness);
          if (!rc) break;
          rc = file.WriteDouble(m_fresnel_index_of_refraction);
          if (!rc) break;
          if (minor_version >= 5)
          {
            rc = file.WriteUuid(m_rdk_material_instance_id);
            if (!rc) break;
          }
          if (minor_version >= 6)
          {
            rc = file.WriteBool(m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
            if (!rc) break;
          }
        }

        break;
      }
      if (!file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  if (rc && file.Archive3dmVersion() < 60)
  {
    if (RdkMaterialInstanceIdIsNotNil())
    {
      // For V5 files and earlier, we need to save
      // the RDK material instance id as user data.
      // Because ON_RdkMaterialInstanceIdObsoleteUserData.DeleteAfterWrite()
      // returns true, the user data we are attaching here will be deleted
      // after it is written.
      ON_RdkMaterialInstanceIdObsoleteUserData* ud = new ON_RdkMaterialInstanceIdObsoleteUserData();
      ud->m_rdk_material_instance_id = RdkMaterialInstanceId();
      const_cast<ON_Material*>(this)->AttachUserData(ud);
    }
  }

  return rc;
}